

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

void uv__signal_block_and_lock(sigset_t *saved_sigmask)

{
  int iVar1;
  undefined1 local_90 [8];
  sigset_t new_mask;
  sigset_t *saved_sigmask_local;
  
  new_mask.__val[0xf] = (unsigned_long)saved_sigmask;
  iVar1 = sigfillset((sigset_t *)local_90);
  if (iVar1 != 0) {
    abort();
  }
  sigemptyset((sigset_t *)new_mask.__val[0xf]);
  iVar1 = pthread_sigmask(2,(__sigset_t *)local_90,(__sigset_t *)new_mask.__val[0xf]);
  if (iVar1 != 0) {
    abort();
  }
  iVar1 = uv__signal_lock();
  if (iVar1 != 0) {
    abort();
  }
  return;
}

Assistant:

static void uv__signal_block_and_lock(sigset_t* saved_sigmask) {
  sigset_t new_mask;

  if (sigfillset(&new_mask))
    abort();

  /* to shut up valgrind */
  sigemptyset(saved_sigmask);
  if (pthread_sigmask(SIG_SETMASK, &new_mask, saved_sigmask))
    abort();

  if (uv__signal_lock())
    abort();
}